

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O0

void __thiscall
libchess::UCIOption<bool>::set_option(UCIOption<bool> *this,value_type_conflict1 *value)

{
  function<void_(const_bool_&)> *in_RSI;
  long in_RDI;
  bool *in_stack_ffffffffffffffe8;
  
  *(byte *)(in_RDI + 0x28) = (in_RSI->super__Function_base)._M_functor._M_pod_data[0] & 1;
  std::function<void_(const_bool_&)>::operator()(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

virtual void set_option(const value_type& value) noexcept {
        value_ = value;
        handler_(value);
    }